

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O3

REF_STATUS ref_swap_remove_two_face_cell(REF_GRID ref_grid,REF_INT cell)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  REF_INT *pRVar3;
  REF_STATUS RVar4;
  uint uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  REF_INT found;
  REF_INT face;
  REF_INT face_nodes [4];
  int local_94;
  int local_90;
  int local_8c;
  REF_INT local_88;
  uint local_84;
  uint local_80;
  int local_7c;
  long local_78;
  REF_INT local_6c;
  undefined8 local_68;
  int local_5c;
  REF_INT local_4c;
  REF_INT local_48 [3];
  int local_3c;
  
  ref_cell = ref_grid->cell[8];
  local_94 = -1;
  lVar12 = 0;
  lVar7 = (long)cell;
  lVar14 = 0;
  local_8c = -1;
  local_84 = 0xffffffff;
  local_80 = 0xffffffff;
  local_7c = -1;
  local_90 = -1;
  local_78 = lVar7;
  local_6c = cell;
  do {
    pRVar2 = ref_cell->c2n;
    iVar1 = ref_cell->size_per;
    pRVar3 = ref_cell->f2n;
    lVar8 = 0;
    do {
      *(REF_INT *)((long)&local_68 + lVar8 * 4) =
           pRVar2[(long)*(int *)((long)pRVar3 + lVar8 * 4 + lVar12) + iVar1 * lVar7];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    RVar4 = ref_cell_with(ref_grid->cell[3],(REF_INT *)&local_68,&local_88);
    if (RVar4 == 0) {
      uVar5 = ref_cell_nodes(ref_grid->cell[3],local_88,local_48);
      if (uVar5 != 0) {
        uVar9 = (ulong)uVar5;
        pcVar11 = "tri";
        uVar6 = 0x38;
        goto LAB_001d4ce4;
      }
      lVar7 = local_78;
      if (local_94 == -1) {
        local_94 = local_88;
        local_90 = local_3c;
        local_84 = (uint)lVar14;
      }
      else {
        if (local_8c != -1) {
          pcVar11 = "three or more faces detected";
          RVar4 = 3;
          uVar6 = 0x3f;
          uVar9 = 3;
          goto LAB_001d4ce7;
        }
        local_8c = local_88;
        local_7c = local_3c;
        local_80 = (uint)lVar14;
      }
    }
    lVar14 = lVar14 + 1;
    lVar12 = lVar12 + 0x10;
  } while (lVar14 != 4);
  RVar4 = 3;
  if (((local_94 != -1) && (local_8c != -1)) && (local_90 == local_7c)) {
    uVar5 = ref_cell_remove(ref_grid->cell[3],local_94);
    if (uVar5 == 0) {
      uVar5 = ref_cell_remove(ref_grid->cell[3],local_8c);
      if (uVar5 == 0) {
        uVar9 = (ulong)local_80;
        uVar10 = (ulong)local_84;
        lVar7 = 0;
        uVar13 = 0;
        do {
          pRVar2 = ref_cell->c2n;
          iVar1 = ref_cell->size_per;
          pRVar3 = ref_cell->f2n;
          lVar12 = 0;
          do {
            *(REF_INT *)((long)&local_68 + lVar12 * 4) =
                 pRVar2[(long)*(int *)((long)pRVar3 + lVar12 * 4 + lVar7) + iVar1 * local_78];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
          if (uVar13 != uVar9 && uVar13 != uVar10) {
            local_5c = local_90;
            local_68 = CONCAT44((int)local_68,(int)((ulong)local_68 >> 0x20));
            uVar5 = ref_cell_add(ref_grid->cell[3],(REF_INT *)&local_68,&local_4c);
            if (uVar5 != 0) {
              uVar9 = (ulong)uVar5;
              pcVar11 = "add tri";
              uVar6 = 0x57;
              goto LAB_001d4ce4;
            }
          }
          uVar13 = uVar13 + 1;
          lVar7 = lVar7 + 0x10;
        } while (uVar13 != 4);
        uVar5 = ref_cell_remove(ref_cell,local_6c);
        if (uVar5 == 0) {
          return 0;
        }
        uVar9 = (ulong)uVar5;
        pcVar11 = "remove tet";
        uVar6 = 0x5b;
      }
      else {
        uVar9 = (ulong)uVar5;
        pcVar11 = "remove tri1";
        uVar6 = 0x4d;
      }
    }
    else {
      uVar9 = (ulong)uVar5;
      pcVar11 = "remove tri0";
      uVar6 = 0x4c;
    }
LAB_001d4ce4:
    RVar4 = (REF_STATUS)uVar9;
LAB_001d4ce7:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",uVar6,
           "ref_swap_remove_two_face_cell",uVar9,pcVar11);
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_swap_remove_two_face_cell(REF_GRID ref_grid,
                                                 REF_INT cell) {
  REF_CELL ref_cell;
  REF_INT cell_face;
  REF_INT node;
  REF_INT cell_nodes[4];
  REF_INT face_nodes[4];
  REF_INT found;
  REF_INT face0, face1;
  REF_INT cell_face0, cell_face1;
  REF_INT faceid0, faceid1;
  REF_INT temp, face;

  ref_cell = ref_grid_tet(ref_grid);

  face0 = REF_EMPTY;
  face1 = REF_EMPTY;
  faceid0 = REF_EMPTY;
  faceid1 = REF_EMPTY;
  cell_face0 = REF_EMPTY;
  cell_face1 = REF_EMPTY;
  for (cell_face = 0; cell_face < 4; cell_face++) {
    for (node = 0; node < 4; node++)
      cell_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
    if (REF_SUCCESS ==
        ref_cell_with(ref_grid_tri(ref_grid), cell_nodes, &found)) {
      RSS(ref_cell_nodes(ref_grid_tri(ref_grid), found, face_nodes), "tri");
      if (REF_EMPTY == face0) {
        face0 = found;
        faceid0 = face_nodes[3];
        cell_face0 = cell_face;
      } else {
        if (REF_EMPTY != face1) {
          RSS(REF_INVALID, "three or more faces detected");
        }
        face1 = found;
        faceid1 = face_nodes[3];
        cell_face1 = cell_face;
      }
    }
  }

  if (REF_EMPTY == face0) return REF_INVALID;
  if (REF_EMPTY == face1) return REF_INVALID;
  if (faceid0 != faceid1) return REF_INVALID;

  RSS(ref_cell_remove(ref_grid_tri(ref_grid), face0), "remove tri0");
  RSS(ref_cell_remove(ref_grid_tri(ref_grid), face1), "remove tri1");

  for (cell_face = 0; cell_face < 4; cell_face++) {
    for (node = 0; node < 4; node++)
      cell_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
    if (cell_face != cell_face0 && cell_face != cell_face1) {
      cell_nodes[3] = faceid0;
      temp = cell_nodes[0];
      cell_nodes[0] = cell_nodes[1];
      cell_nodes[1] = temp;
      RSS(ref_cell_add(ref_grid_tri(ref_grid), cell_nodes, &face), "add tri");
    }
  }

  RSS(ref_cell_remove(ref_cell, cell), "remove tet");

  return REF_SUCCESS;
}